

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

bool flatbuffers::anon_unknown_0::CompareTablesByScalarKey
               (Offset<flatbuffers::Table> *_a,Offset<flatbuffers::Table> *_b,FieldDef *key)

{
  voffset_t field;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint8_t *a_00;
  uint8_t *b_00;
  uint8_t *b;
  uint8_t *a;
  voffset_t offset;
  FieldDef *key_local;
  Offset<flatbuffers::Table> *_b_local;
  Offset<flatbuffers::Table> *_a_local;
  
  field = (key->value).offset;
  uVar2 = ReadScalar<unsigned_int>(_a);
  uVar3 = ReadScalar<unsigned_int>(_b);
  a_00 = Table::GetAddressOf((Table *)((long)&_a->o + (ulong)uVar2),field);
  b_00 = Table::GetAddressOf((Table *)((long)&_b->o + (ulong)uVar3),field);
  bVar1 = CompareSerializedScalars(a_00,b_00,key);
  return bVar1;
}

Assistant:

static bool CompareTablesByScalarKey(const Offset<Table> *_a,
                                     const Offset<Table> *_b,
                                     const FieldDef &key) {
  const voffset_t offset = key.value.offset;
  // Indirect offset pointer to table pointer.
  auto a = reinterpret_cast<const uint8_t *>(_a) + ReadScalar<uoffset_t>(_a);
  auto b = reinterpret_cast<const uint8_t *>(_b) + ReadScalar<uoffset_t>(_b);
  // Fetch field address from table.
  a = reinterpret_cast<const Table *>(a)->GetAddressOf(offset);
  b = reinterpret_cast<const Table *>(b)->GetAddressOf(offset);
  return CompareSerializedScalars(a, b, key);
}